

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uppity.c
# Opt level: O1

Plug * server_conn_plug(server_config *cfg,server_instance **inst_out)

{
  uint uVar1;
  server_instance *psVar2;
  Plug *pPVar3;
  
  psVar2 = (server_instance *)safemalloc(1,0x28,0);
  *(undefined8 *)psVar2 = 0;
  (psVar2->ap).shared = (AuthPolicyShared *)0x0;
  *(undefined8 *)&(psVar2->ap).kbdint_state = 0;
  (psVar2->logpolicy).vt = (LogPolicyVtable *)0x0;
  psVar2->cfg = (server_config *)0x0;
  uVar1 = next_id + 1;
  psVar2->id = next_id;
  next_id = uVar1;
  (psVar2->ap).shared = cfg->ap_shared;
  if (cfg->ssc->stunt_allow_trivial_ki_auth == true) {
    (psVar2->ap).kbdint_state = 1;
  }
  (psVar2->logpolicy).vt = &server_logpolicy_vt;
  psVar2->cfg = cfg;
  if (inst_out != (server_instance **)0x0) {
    *inst_out = psVar2;
  }
  pPVar3 = ssh_server_plug(cfg->conf,cfg->ssc,cfg->hostkeys,cfg->nhostkeys,cfg->hostkey1,&psVar2->ap
                           ,&psVar2->logpolicy,&unix_live_sftpserver_vt);
  return pPVar3;
}

Assistant:

static Plug *server_conn_plug(
    struct server_config *cfg, struct server_instance **inst_out)
{
    struct server_instance *inst = snew(struct server_instance);

    memset(inst, 0, sizeof(*inst));

    inst->id = next_id++;
    inst->ap.shared = cfg->ap_shared;
    if (cfg->ssc->stunt_allow_trivial_ki_auth)
        inst->ap.kbdint_state = 1;
    inst->logpolicy.vt = &server_logpolicy_vt;
    inst->cfg = cfg;

    if (inst_out)
        *inst_out = inst;

    return ssh_server_plug(
        cfg->conf, cfg->ssc, cfg->hostkeys, cfg->nhostkeys, cfg->hostkey1,
        &inst->ap, &inst->logpolicy, &unix_live_sftpserver_vt);
}